

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableDrawBorders(ImGuiTable *table)

{
  float *pfVar1;
  ImRect *pIVar2;
  ImVec2 *pIVar3;
  char cVar4;
  ImGuiWindow *pIVar5;
  ImDrawList *draw_list;
  ImVec2 IVar6;
  ImU32 IVar7;
  uint uVar8;
  char *pcVar9;
  ulong uVar10;
  ImGuiCol idx;
  ImGuiTableColumn *pIVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  ImRect outer_border;
  ImVec2 local_60;
  float local_54;
  float local_50;
  float local_4c;
  ImVec2 local_48;
  ImVec2 aIStack_40 [2];
  
  pIVar5 = table->OuterWindow;
  fVar14 = (pIVar5->ClipRect).Max.y;
  pfVar1 = &(table->OuterRect).Min.y;
  if (fVar14 < *pfVar1 || fVar14 == *pfVar1) {
    return;
  }
  fVar14 = (table->OuterRect).Max.y;
  pfVar1 = &(pIVar5->ClipRect).Min.y;
  if (fVar14 < *pfVar1 || fVar14 == *pfVar1) {
    return;
  }
  pIVar2 = &table->OuterRect;
  fVar14 = (pIVar5->ClipRect).Max.x;
  if (fVar14 < (pIVar2->Min).x || fVar14 == (pIVar2->Min).x) {
    return;
  }
  fVar14 = (table->OuterRect).Max.x;
  if (fVar14 < (pIVar5->ClipRect).Min.x || fVar14 == (pIVar5->ClipRect).Min.x) {
    return;
  }
  draw_list = table->InnerWindow->DrawList;
  ImDrawListSplitter::SetCurrentChannel(table->DrawSplitter,draw_list,0);
  ImDrawList::PushClipRect
            (draw_list,(table->Bg0ClipRectForDrawCmd).Min,(table->Bg0ClipRectForDrawCmd).Max,false);
  fVar14 = (table->InnerRect).Min.y;
  fVar15 = (table->InnerRect).Max.y;
  local_4c = fVar14;
  if (table->IsUsingHeaders == true) {
    fVar13 = fVar14;
    if (table->FreezeRowsCount < '\x01') {
      fVar13 = (table->WorkRect).Min.y;
    }
    fVar13 = fVar13 + table->LastFirstRowHeight;
    local_4c = fVar15;
    if (fVar13 <= fVar15) {
      local_4c = fVar13;
    }
  }
  uVar8 = table->Flags;
  if (((uVar8 >> 9 & 1) != 0) && (0 < table->ColumnsCount)) {
    uVar10 = 0;
    local_54 = fVar15;
    local_50 = fVar14;
    do {
      if ((table->EnabledMaskByDisplayOrder >> (uVar10 & 0x3f) & 1) == 0) goto LAB_00215910;
      pcVar9 = (table->DisplayOrderToIndex).Data + uVar10;
      if ((table->DisplayOrderToIndex).DataEnd <= pcVar9) {
        pcVar9 = "T &ImSpan<signed char>::operator[](int) [T = signed char]";
LAB_00215aee:
        __assert_fail("p >= Data && p < DataEnd",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_internal.h"
                      ,0x24a,pcVar9);
      }
      cVar4 = *pcVar9;
      if (((long)cVar4 < 0) ||
         (pIVar11 = (table->Columns).Data + cVar4, (table->Columns).DataEnd <= pIVar11)) {
        pcVar9 = "T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]";
        goto LAB_00215aee;
      }
      if (table->ResizedColumn == cVar4) {
        bVar12 = table->InstanceInteracted == table->InstanceCurrent;
      }
      else {
        bVar12 = false;
      }
      fVar13 = pIVar11->MaxX;
      pIVar3 = &(table->InnerClipRect).Max;
      if ((bool)((fVar13 < pIVar3->x || fVar13 == pIVar3->x) | bVar12)) {
        if ((((pIVar11->NextEnabledColumn != -1) || ((pIVar11->Flags & 0x40000020U) == 0)) ||
            ((table->Flags & 0x1e000U) == 0x4000)) && ((pIVar11->ClipRect).Min.x < fVar13)) {
          fVar13 = fVar15;
          if ((table->HoveredColumnBorder == cVar4 || bVar12) ||
             (uVar10 + 1 == (ulong)(uint)(int)table->FreezeColumnsCount)) {
            if (bVar12) {
              idx = 0x1d;
            }
            else {
              if (table->HoveredColumnBorder != cVar4) {
                IVar7 = table->BorderColorStrong;
                goto LAB_002158c6;
              }
              idx = 0x1c;
            }
            IVar7 = GetColorU32(idx,1.0);
            fVar13 = local_54;
            fVar14 = local_50;
            fVar15 = local_54;
          }
          else {
            bVar12 = (table->Flags & 0x1800) == 0;
            if (!bVar12) {
              fVar13 = local_4c;
            }
            IVar7 = table->RowBgColor[(ulong)bVar12 + 2];
          }
LAB_002158c6:
          if (fVar14 < fVar13) {
            local_48.x = pIVar11->MaxX;
            local_60.y = fVar13;
            local_60.x = local_48.x;
            local_48.y = fVar14;
            ImDrawList::AddLine(draw_list,&local_48,&local_60,IVar7,1.0);
            fVar14 = local_50;
            fVar15 = local_54;
          }
        }
      }
LAB_00215910:
      uVar10 = uVar10 + 1;
    } while ((long)uVar10 < (long)table->ColumnsCount);
    uVar8 = table->Flags;
  }
  if ((uVar8 & 0x500) == 0) goto LAB_00215a3a;
  IVar6 = (table->OuterRect).Max;
  local_48.x = (pIVar2->Min).x;
  local_48.y = (pIVar2->Min).y;
  aIStack_40[0].x = IVar6.x;
  aIStack_40[0].y = IVar6.y;
  IVar7 = table->BorderColorStrong;
  if ((uVar8 & 0x500) == 0x500) {
    ImDrawList::AddRect(draw_list,&local_48,aIStack_40,IVar7,0.0,0,1.0);
  }
  else {
    if ((uVar8 >> 10 & 1) == 0) {
      if ((uVar8 >> 8 & 1) == 0) goto LAB_00215a37;
      local_60.y = local_48.y;
      local_60.x = aIStack_40[0].x;
      ImDrawList::AddLine(draw_list,&local_48,&local_60,IVar7,1.0);
      local_60.y = aIStack_40[0].y;
      local_60.x = local_48.x;
    }
    else {
      local_60.y = aIStack_40[0].y;
      local_60.x = local_48.x;
      ImDrawList::AddLine(draw_list,&local_48,&local_60,IVar7,1.0);
      local_60.y = local_48.y;
      local_60.x = aIStack_40[0].x;
    }
    ImDrawList::AddLine(draw_list,&local_60,aIStack_40,IVar7,1.0);
  }
LAB_00215a37:
  uVar8 = table->Flags;
LAB_00215a3a:
  if ((((char)uVar8 < '\0') && (fVar14 = table->RowPosY2, fVar14 < (table->OuterRect).Max.y)) &&
     (((table->BgClipRect).Min.y <= fVar14 && (fVar14 < (table->BgClipRect).Max.y)))) {
    local_48.x = table->BorderX1;
    local_60.y = fVar14;
    local_60.x = table->BorderX2;
    local_48.y = fVar14;
    ImDrawList::AddLine(draw_list,&local_48,&local_60,table->BorderColorLight,1.0);
  }
  ImDrawList::PopClipRect(draw_list);
  return;
}

Assistant:

void ImGui::TableDrawBorders(ImGuiTable* table)
{
    ImGuiWindow* inner_window = table->InnerWindow;
    if (!table->OuterWindow->ClipRect.Overlaps(table->OuterRect))
        return;

    ImDrawList* inner_drawlist = inner_window->DrawList;
    table->DrawSplitter->SetCurrentChannel(inner_drawlist, TABLE_DRAW_CHANNEL_BG0);
    inner_drawlist->PushClipRect(table->Bg0ClipRectForDrawCmd.Min, table->Bg0ClipRectForDrawCmd.Max, false);

    // Draw inner border and resizing feedback
    const float border_size = TABLE_BORDER_SIZE;
    const float draw_y1 = table->InnerRect.Min.y;
    const float draw_y2_body = table->InnerRect.Max.y;
    const float draw_y2_head = table->IsUsingHeaders ? ImMin(table->InnerRect.Max.y, (table->FreezeRowsCount >= 1 ? table->InnerRect.Min.y : table->WorkRect.Min.y) + table->LastFirstRowHeight) : draw_y1;
    if (table->Flags & ImGuiTableFlags_BordersInnerV)
    {
        for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
        {
            if (!(table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;

            const int column_n = table->DisplayOrderToIndex[order_n];
            ImGuiTableColumn* column = &table->Columns[column_n];
            const bool is_hovered = (table->HoveredColumnBorder == column_n);
            const bool is_resized = (table->ResizedColumn == column_n) && (table->InstanceInteracted == table->InstanceCurrent);
            const bool is_resizable = (column->Flags & (ImGuiTableColumnFlags_NoResize | ImGuiTableColumnFlags_NoDirectResize_)) == 0;
            const bool is_frozen_separator = (table->FreezeColumnsCount == order_n + 1);
            if (column->MaxX > table->InnerClipRect.Max.x && !is_resized)
                continue;

            // Decide whether right-most column is visible
            if (column->NextEnabledColumn == -1 && !is_resizable)
                if ((table->Flags & ImGuiTableFlags_SizingMask_) != ImGuiTableFlags_SizingFixedSame || (table->Flags & ImGuiTableFlags_NoHostExtendX))
                    continue;
            if (column->MaxX <= column->ClipRect.Min.x) // FIXME-TABLE FIXME-STYLE: Assume BorderSize==1, this is problematic if we want to increase the border size..
                continue;

            // Draw in outer window so right-most column won't be clipped
            // Always draw full height border when being resized/hovered, or on the delimitation of frozen column scrolling.
            ImU32 col;
            float draw_y2;
            if (is_hovered || is_resized || is_frozen_separator)
            {
                draw_y2 = draw_y2_body;
                col = is_resized ? GetColorU32(ImGuiCol_SeparatorActive) : is_hovered ? GetColorU32(ImGuiCol_SeparatorHovered) : table->BorderColorStrong;
            }
            else
            {
                draw_y2 = (table->Flags & (ImGuiTableFlags_NoBordersInBody | ImGuiTableFlags_NoBordersInBodyUntilResize)) ? draw_y2_head : draw_y2_body;
                col = (table->Flags & (ImGuiTableFlags_NoBordersInBody | ImGuiTableFlags_NoBordersInBodyUntilResize)) ? table->BorderColorStrong : table->BorderColorLight;
            }

            if (draw_y2 > draw_y1)
                inner_drawlist->AddLine(ImVec2(column->MaxX, draw_y1), ImVec2(column->MaxX, draw_y2), col, border_size);
        }
    }

    // Draw outer border
    // FIXME: could use AddRect or explicit VLine/HLine helper?
    if (table->Flags & ImGuiTableFlags_BordersOuter)
    {
        // Display outer border offset by 1 which is a simple way to display it without adding an extra draw call
        // (Without the offset, in outer_window it would be rendered behind cells, because child windows are above their
        // parent. In inner_window, it won't reach out over scrollbars. Another weird solution would be to display part
        // of it in inner window, and the part that's over scrollbars in the outer window..)
        // Either solution currently won't allow us to use a larger border size: the border would clipped.
        const ImRect outer_border = table->OuterRect;
        const ImU32 outer_col = table->BorderColorStrong;
        if ((table->Flags & ImGuiTableFlags_BordersOuter) == ImGuiTableFlags_BordersOuter)
        {
            inner_drawlist->AddRect(outer_border.Min, outer_border.Max, outer_col, 0.0f, 0, border_size);
        }
        else if (table->Flags & ImGuiTableFlags_BordersOuterV)
        {
            inner_drawlist->AddLine(outer_border.Min, ImVec2(outer_border.Min.x, outer_border.Max.y), outer_col, border_size);
            inner_drawlist->AddLine(ImVec2(outer_border.Max.x, outer_border.Min.y), outer_border.Max, outer_col, border_size);
        }
        else if (table->Flags & ImGuiTableFlags_BordersOuterH)
        {
            inner_drawlist->AddLine(outer_border.Min, ImVec2(outer_border.Max.x, outer_border.Min.y), outer_col, border_size);
            inner_drawlist->AddLine(ImVec2(outer_border.Min.x, outer_border.Max.y), outer_border.Max, outer_col, border_size);
        }
    }
    if ((table->Flags & ImGuiTableFlags_BordersInnerH) && table->RowPosY2 < table->OuterRect.Max.y)
    {
        // Draw bottom-most row border
        const float border_y = table->RowPosY2;
        if (border_y >= table->BgClipRect.Min.y && border_y < table->BgClipRect.Max.y)
            inner_drawlist->AddLine(ImVec2(table->BorderX1, border_y), ImVec2(table->BorderX2, border_y), table->BorderColorLight, border_size);
    }

    inner_drawlist->PopClipRect();
}